

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *pcVar1;
  size_type sVar2;
  int iVar3;
  ostream *poVar4;
  runtime_error *prVar5;
  pointer puVar6;
  iterator __end1;
  pointer puVar7;
  string file_in;
  string file_out;
  string cmd;
  HuffmanArchiver h;
  ifstream cin;
  ofstream cout;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  long *local_4c8;
  long local_4c0;
  long local_4b8 [2];
  HuffmanArchiver local_4a8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_458;
  long *local_438 [2];
  long local_428 [2];
  byte abStack_418 [488];
  long local_230;
  filebuf local_228 [24];
  byte abStack_210 [216];
  ios_base local_138 [264];
  
  if (argc < 6) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Not enough arquments, need 6!",0x1d);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
    std::ostream::put(' ');
    puVar6 = (pointer)0x0;
    std::ostream::flush();
    puVar7 = (pointer)0x0;
    goto LAB_0010596a;
  }
  std::__cxx11::string::string((string *)&local_4c8,argv[1],(allocator *)local_438);
  local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
  local_508._M_string_length = 0;
  local_508.field_2._M_local_buf[0] = '\0';
  local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
  local_4e8._M_string_length = 0;
  local_4e8.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)local_438,argv[2],(allocator *)&local_230);
  iVar3 = std::__cxx11::string::compare((char *)local_438);
  if (local_438[0] != local_428) {
    operator_delete(local_438[0],local_428[0] + 1);
  }
  sVar2 = local_508._M_string_length;
  if (iVar3 == 0) {
    pcVar1 = argv[3];
    strlen(pcVar1);
    std::__cxx11::string::_M_replace((ulong)&local_508,0,(char *)sVar2,(ulong)pcVar1);
    std::__cxx11::string::string((string *)local_438,argv[4],(allocator *)&local_230);
    iVar3 = std::__cxx11::string::compare((char *)local_438);
    if (local_438[0] != local_428) {
      operator_delete(local_438[0],local_428[0] + 1);
    }
    sVar2 = local_4e8._M_string_length;
    if (iVar3 != 0) goto LAB_001058d2;
    pcVar1 = argv[5];
    strlen(pcVar1);
    std::__cxx11::string::_M_replace((ulong)&local_4e8,0,(char *)sVar2,(ulong)pcVar1);
    std::ifstream::ifstream(local_438);
    std::ofstream::ofstream(&local_230);
    std::ifstream::open((string *)local_438,(_Ios_Openmode)&local_508);
    std::ofstream::open((string *)&local_230,(_Ios_Openmode)&local_4e8);
    if ((abStack_418[local_438[0][-3]] & 5) != 0) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_4a8
                     ,"Could not open file ",&local_508);
      std::runtime_error::runtime_error(prVar5,(string *)&local_4a8);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((abStack_210[*(long *)(local_230 + -0x18)] & 5) != 0) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_4a8
                     ,"Could not open file ",&local_4e8);
      std::runtime_error::runtime_error(prVar5,(string *)&local_4a8);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    HuffmanArchiver::HuffmanArchiver(&local_4a8);
    iVar3 = std::__cxx11::string::compare((char *)&local_4c8);
    if (iVar3 == 0) {
      HuffmanArchiver::zip(&local_4a8,(istream *)local_438,(ostream *)&local_230);
LAB_00105b34:
      HuffmanArchiver::info(&local_458,&local_4a8);
      for (puVar6 = local_458.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          puVar6 != local_458.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish; puVar6 = puVar6 + 1) {
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
      }
      std::ifstream::close();
      std::ofstream::close();
      puVar6 = local_458.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      puVar7 = local_458.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)&local_4c8);
      if (iVar3 == 0) {
        HuffmanArchiver::unzip(&local_4a8,(istream *)local_438,(ostream *)&local_230);
        goto LAB_00105b34;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Unknown command \'",0x11);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_4c8,local_4c0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\'!",2);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      puVar6 = (pointer)0x0;
      puVar7 = (pointer)0x0;
    }
    std::
    _Hashtable<char,_std::pair<const_char,_int>,_std::allocator<std::pair<const_char,_int>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_4a8._data._M_h);
    local_230 = _VTT;
    *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
    std::filebuf::~filebuf(local_228);
    std::ios_base::~ios_base(local_138);
    std::ifstream::~ifstream(local_438);
  }
  else {
LAB_001058d2:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Invalid arguments!",0x12);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
    std::ostream::put(' ');
    puVar6 = (pointer)0x0;
    std::ostream::flush();
    puVar7 = (pointer)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
    operator_delete(local_4e8._M_dataplus._M_p,
                    CONCAT71(local_4e8.field_2._M_allocated_capacity._1_7_,
                             local_4e8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_508._M_dataplus._M_p != &local_508.field_2) {
    operator_delete(local_508._M_dataplus._M_p,
                    CONCAT71(local_508.field_2._M_allocated_capacity._1_7_,
                             local_508.field_2._M_local_buf[0]) + 1);
  }
  if (local_4c8 != local_4b8) {
    operator_delete(local_4c8,local_4b8[0] + 1);
  }
LAB_0010596a:
  if (puVar7 != (pointer)0x0) {
    operator_delete(puVar7,(long)puVar6 - (long)puVar7);
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    std::vector<std::size_t> info;
    if (argc < 6) {
        std::cout << "Not enough arquments, need 6!" << std::endl;
        return 0;
    }

    bool f = false;
    std::string cmd = argv[1], file_in, file_out;
    if (std::string(argv[2]) == "-f") {
        file_in = argv[3];
        if (std::string(argv[4]) == "-o") {
            file_out = argv[5];
        } else {
            f = true;
        }
    } else {
        f = true;
    }

    if (f) {
        std::cout << "Invalid arguments!" << std::endl;
        return 0;
    }
    std::ifstream cin;
    std::ofstream cout;

    try {
        cin.open(file_in);
        cout.open(file_out);
        if (!cin) {
            throw std::runtime_error("Could not open file " + file_in);
        }
        if (!cout) {
            throw std::runtime_error("Could not open file " + file_out);
        }
    } catch (std::exception &e) {
        std::cout << e.what() << "!\n";
        return 0;
    }

    HuffmanArchiver h;
    if (cmd == "-c") {
        try {
            h.zip(cin, cout);
        } catch (HuffmanException &e) {
            std::cout << e.what() << std::endl;
            return 0;
        } catch (std::exception &e) {
            std::cout << "Standart exception: " << e.what() << std::endl;
            return 0;
        }
    } else if (cmd == "-u") {
        try {
            h.unzip(cin, cout);
        } catch (HuffmanException &e) {
            std::cout << e.what() << std::endl;
            return 0;
        } catch (std::exception &e) {
            std::cout << "Standart exception: " << e.what() << std::endl;
            return 0;
        }
    } else {
        std::cout << "Unknown command '"<< cmd << "'!" << std::endl;
        return 0;
    }

    info = h.info();
    for (auto n : info) {
        std::cout << n << std::endl;
    }
    cin.close();
    cout.close();
    return 0;
}